

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCreatePropertyMonitor(Abc_Ntk_t *p,Vec_Int_t *vNodeIds,Vec_Int_t *vNodeValues)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pNtk;
  
  if (p->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xbe1,
                  "Abc_Ntk_t *Abc_NtkCreatePropertyMonitor(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (p->nObjCounts[8] < 1) {
    __assert_fail("Abc_NtkLatchNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xbe2,
                  "Abc_Ntk_t *Abc_NtkCreatePropertyMonitor(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vNodeIds->nSize < 1) {
    __assert_fail("Vec_IntSize(vNodeIds) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xbe3,
                  "Abc_Ntk_t *Abc_NtkCreatePropertyMonitor(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vNodeIds->nSize == vNodeValues->nSize) {
    pAVar1 = Abc_NtkDeriveWithOnePo(p,vNodeIds,vNodeValues);
    pNtk = Abc_NtkStrash(pAVar1,0,1,0);
    Abc_NtkDelete(pAVar1);
    pAVar1 = Abc_NtkDarLatchSweep(pNtk,1,1,1,0,1,0x200,0,0);
    Abc_NtkDelete(pNtk);
    return pAVar1;
  }
  __assert_fail("Vec_IntSize(vNodeIds) == Vec_IntSize(vNodeValues)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xbe4,
                "Abc_Ntk_t *Abc_NtkCreatePropertyMonitor(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCreatePropertyMonitor( Abc_Ntk_t * p, Vec_Int_t * vNodeIds, Vec_Int_t * vNodeValues )
{
    Abc_Ntk_t * pMonitor, * pStrashed, * pResult;
    // sequential cleanup parameters
    int fLatchConst  =   1;
    int fLatchEqual  =   1;
    int fSaveNames   =   1;
    int fUseMvSweep  =   0;
    int nFramesSymb  =   1;
    int nFramesSatur = 512;
    int fVerbose     =   0;
    int fVeryVerbose =   0;
    // expecting sequential logic network
    assert( Abc_NtkIsLogic(p) );
    assert( Abc_NtkLatchNum(p) > 0 );
    assert( Vec_IntSize(vNodeIds) > 0 );
    assert( Vec_IntSize(vNodeIds) == Vec_IntSize(vNodeValues) );
    // derive ABC network whose only output is 1 iff the given nodes have the given values
    pMonitor = Abc_NtkDeriveWithOnePo( p, vNodeIds, vNodeValues );
    // perform structural hashing
    pStrashed = Abc_NtkStrash( pMonitor, 0, 1, 0 );
    Abc_NtkDelete( pMonitor );
    // it is a good idea to run sequential cleanup before giving the network to PDR
    pResult = Abc_NtkDarLatchSweep( pStrashed, fLatchConst, fLatchEqual, fSaveNames, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    Abc_NtkDelete( pStrashed );
    return pResult;
}